

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

char * readDataOfferAsString(wl_data_offer *offer,char *mimeType)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ulong size_00;
  ssize_t sVar4;
  ssize_t result;
  char *longer;
  size_t requiredSize;
  size_t readSize;
  size_t length;
  size_t size;
  char *string;
  int fds [2];
  char *mimeType_local;
  wl_data_offer *offer_local;
  
  fds = (int  [2])mimeType;
  iVar1 = pipe2((int *)&string,0x80000);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _glfwInputError(0x10008,"Wayland: Failed to create pipe for data offer: %s",pcVar3);
  }
  else {
    wl_data_offer_receive(offer,(char *)fds,string._4_4_);
    flushDisplay();
    close(string._4_4_);
    size = 0;
    length = 0;
    readSize = 0;
    do {
      while( true ) {
        size_00 = readSize + 0x1001;
        if ((length < size_00) &&
           (size = (size_t)_glfw_realloc((void *)size,size_00), length = size_00,
           (void *)size == (void *)0x0)) {
          _glfwInputError(0x10005,(char *)0x0);
          close((int)string);
          return (char *)0x0;
        }
        sVar4 = read((int)string,(void *)(size + readSize),0x1000);
        if (sVar4 == 0) {
          close((int)string);
          *(undefined1 *)(size + readSize) = 0;
          return (char *)size;
        }
        if (sVar4 == -1) break;
        readSize = sVar4 + readSize;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _glfwInputError(0x10008,"Wayland: Failed to read from data offer pipe: %s",pcVar3);
    close((int)string);
  }
  return (char *)0x0;
}

Assistant:

static char* readDataOfferAsString(struct wl_data_offer* offer, const char* mimeType)
{
    int fds[2];

    if (pipe2(fds, O_CLOEXEC) == -1)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create pipe for data offer: %s",
                        strerror(errno));
        return NULL;
    }

    wl_data_offer_receive(offer, mimeType, fds[1]);
    flushDisplay();
    close(fds[1]);

    char* string = NULL;
    size_t size = 0;
    size_t length = 0;

    for (;;)
    {
        const size_t readSize = 4096;
        const size_t requiredSize = length + readSize + 1;
        if (requiredSize > size)
        {
            char* longer = _glfw_realloc(string, requiredSize);
            if (!longer)
            {
                _glfwInputError(GLFW_OUT_OF_MEMORY, NULL);
                close(fds[0]);
                return NULL;
            }

            string = longer;
            size = requiredSize;
        }

        const ssize_t result = read(fds[0], string + length, readSize);
        if (result == 0)
            break;
        else if (result == -1)
        {
            if (errno == EINTR)
                continue;

            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Wayland: Failed to read from data offer pipe: %s",
                            strerror(errno));
            close(fds[0]);
            return NULL;
        }

        length += result;
    }

    close(fds[0]);

    string[length] = '\0';
    return string;
}